

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dmyblas2.c
# Opt level: O1

void dusolve(int ldm,int ncol,double *M,double *rhs)

{
  double dVar1;
  double dVar2;
  ulong uVar3;
  ulong uVar4;
  double *pdVar5;
  uint uVar6;
  int iVar7;
  
  if (0 < ncol) {
    pdVar5 = M + ((ulong)(uint)ncol - 1) * (long)ldm;
    uVar6 = ncol - 1;
    iVar7 = 0;
    uVar4 = (ulong)(uint)ncol;
    do {
      dVar1 = rhs[uVar4 - 1];
      dVar2 = M[uVar4 + (long)((int)(uVar4 - 1) * ldm) + -1];
      rhs[uVar4 - 1] = dVar1 / dVar2;
      if (1 < (long)uVar4) {
        uVar3 = 0;
        do {
          rhs[uVar3] = pdVar5[uVar3] * -(dVar1 / dVar2) + rhs[uVar3];
          uVar3 = uVar3 + 1;
        } while (uVar6 != uVar3);
      }
      iVar7 = iVar7 + 1;
      pdVar5 = pdVar5 + -(long)ldm;
      uVar6 = uVar6 - 1;
      uVar4 = uVar4 - 1;
    } while (iVar7 != ncol);
  }
  return;
}

Assistant:

void dusolve (int ldm, int ncol, double *M, double *rhs)
{
    double xj;
    int jcol, j, irow;

    jcol = ncol - 1;

    for (j = 0; j < ncol; j++) {

	xj = rhs[jcol] / M[jcol + jcol*ldm]; 		/* M(jcol, jcol) */
	rhs[jcol] = xj;
	
	for (irow = 0; irow < jcol; irow++)
	    rhs[irow] -= xj * M[irow + jcol*ldm];	/* M(irow, jcol) */

	jcol--;

    }
}